

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O0

difference_type
ft::distance<ft::listIterator<int>>(listIterator<int> *first,listIterator<int> *last,type *param_3)

{
  difference_type dVar1;
  listIterator<int> local_40;
  listIterator<int> local_30;
  type *local_20;
  type *param_2_local;
  listIterator<int> *last_local;
  listIterator<int> *first_local;
  
  local_20 = param_3;
  param_2_local = last;
  last_local = first;
  listIterator<int>::listIterator(&local_30,first);
  listIterator<int>::listIterator(&local_40,last);
  dVar1 = _distance<ft::listIterator<int>>(&local_30,&local_40);
  listIterator<int>::~listIterator(&local_40);
  listIterator<int>::~listIterator(&local_30);
  return dVar1;
}

Assistant:

typename ft::iterator_traits<InputIter>::difference_type
	distance(InputIter first, InputIter last,
			 typename ft::_void_t<typename ft::iterator_traits<InputIter>::iterator_category>::type * = 0) {
	return ft::_distance(first, last, typename ft::iterator_traits<InputIter>::iterator_category());
}